

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  ExprList *pList;
  short sVar1;
  int iVar2;
  Column *p;
  
  p = pTable->aCol;
  if (p != (Column *)0x0) {
    sVar1 = pTable->nCol;
    if (0 < sVar1) {
      iVar2 = 0;
      do {
        if (p->zCnName != (char *)0x0) {
          sqlite3DbFreeNN(db,p->zCnName);
          sVar1 = pTable->nCol;
        }
        iVar2 = iVar2 + 1;
        p = p + 1;
      } while (iVar2 < sVar1);
      p = pTable->aCol;
    }
    sqlite3DbNNFreeNN(db,p);
    if ((pTable->eTabType == '\0') && (pList = (pTable->u).tab.pDfltList, pList != (ExprList *)0x0))
    {
      exprListDeleteNN(db,pList);
    }
    if (db->pnBytesFreed == (int *)0x0) {
      pTable->aCol = (Column *)0x0;
      pTable->nCol = 0;
      if (pTable->eTabType == '\0') {
        (pTable->u).tab.pDfltList = (ExprList *)0x0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  assert( db!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      assert( pCol->zCnName==0 || pCol->hName==sqlite3StrIHash(pCol->zCnName) );
      sqlite3DbFree(db, pCol->zCnName);
    }
    sqlite3DbNNFreeNN(db, pTable->aCol);
    if( IsOrdinaryTable(pTable) ){
      sqlite3ExprListDelete(db, pTable->u.tab.pDfltList);
    }
    if( db->pnBytesFreed==0 ){
      pTable->aCol = 0;
      pTable->nCol = 0;
      if( IsOrdinaryTable(pTable) ){
        pTable->u.tab.pDfltList = 0;
      }
    }
  }
}